

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearPosition.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearPosition::Update
          (ChLinkMotorLinearPosition *this,double mytime,bool update_assets)

{
  double dVar1;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  dVar1 = (this->super_ChLinkMotorLinear).mpos;
  (*((this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  if (0 < (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows) {
    (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (dVar1 - mytime) - *(double *)&(this->super_ChLinkMotorLinear).field_0x278;
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkMotorLinearPosition::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Add the time-dependent term in residual C as
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A- x_pos_B, and d_setpoint = x(t)
    C(0) = this->mpos - m_func->Get_y(mytime) - this->pos_offset;
}